

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

int get_var_perceptual_ai(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  uint uVar1;
  uint mi_row_00;
  int iVar2;
  int iVar3;
  int iVar4;
  AV1_COMP *cpi_00;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  int sb_wiener_var;
  int mi_high;
  int mi_wide;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffd4;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x3bf80);
  uVar1 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_SIL]
  ;
  mi_row_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [in_SIL];
  iVar2 = get_window_wiener_var(cpi_00,BLOCK_4X4,mi_row_00,in_stack_ffffffffffffffd4);
  iVar4 = iVar2;
  if (((int)mi_row_00 / 2 <= in_EDX) &&
     (iVar3 = get_window_wiener_var(cpi_00,(BLOCK_SIZE)(uVar1 >> 0x18),mi_row_00,iVar2),
     iVar3 <= iVar2)) {
    iVar4 = get_window_wiener_var(cpi_00,(BLOCK_SIZE)(uVar1 >> 0x18),mi_row_00,iVar4);
  }
  iVar2 = iVar4;
  if ((in_EDX <= (int)((*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x20] + 2) -
                       mi_row_00) - (int)mi_row_00 / 2)) &&
     (iVar3 = get_window_wiener_var(cpi_00,(BLOCK_SIZE)(uVar1 >> 0x18),mi_row_00,iVar4),
     iVar3 <= iVar4)) {
    iVar2 = get_window_wiener_var(cpi_00,(BLOCK_SIZE)(uVar1 >> 0x18),mi_row_00,iVar2);
  }
  iVar4 = iVar2;
  if (((int)uVar1 / 2 <= in_ECX) &&
     (iVar3 = get_window_wiener_var(cpi_00,(BLOCK_SIZE)(uVar1 >> 0x18),mi_row_00,iVar2),
     iVar3 <= iVar2)) {
    iVar4 = get_window_wiener_var(cpi_00,(BLOCK_SIZE)(uVar1 >> 0x18),mi_row_00,iVar4);
  }
  iVar2 = iVar4;
  if ((in_ECX <= (int)((*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x20] + 4) -
                       uVar1) - (int)uVar1 / 2)) &&
     (iVar3 = get_window_wiener_var(cpi_00,(BLOCK_SIZE)(uVar1 >> 0x18),mi_row_00,iVar4),
     iVar3 <= iVar4)) {
    iVar2 = get_window_wiener_var(cpi_00,(BLOCK_SIZE)(uVar1 >> 0x18),mi_row_00,iVar2);
  }
  return iVar2;
}

Assistant:

static int get_var_perceptual_ai(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                 int mi_row, int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  int sb_wiener_var = get_window_wiener_var(cpi, bsize, mi_row, mi_col);

  if (mi_row >= (mi_high / 2)) {
    sb_wiener_var =
        AOMMIN(sb_wiener_var,
               get_window_wiener_var(cpi, bsize, mi_row - mi_high / 2, mi_col));
  }
  if (mi_row <= (cm->mi_params.mi_rows - mi_high - (mi_high / 2))) {
    sb_wiener_var =
        AOMMIN(sb_wiener_var,
               get_window_wiener_var(cpi, bsize, mi_row + mi_high / 2, mi_col));
  }
  if (mi_col >= (mi_wide / 2)) {
    sb_wiener_var =
        AOMMIN(sb_wiener_var,
               get_window_wiener_var(cpi, bsize, mi_row, mi_col - mi_wide / 2));
  }
  if (mi_col <= (cm->mi_params.mi_cols - mi_wide - (mi_wide / 2))) {
    sb_wiener_var =
        AOMMIN(sb_wiener_var,
               get_window_wiener_var(cpi, bsize, mi_row, mi_col + mi_wide / 2));
  }

  return sb_wiener_var;
}